

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

uint8 * __thiscall
google::protobuf::EnumDescriptorProto::InternalSerializeWithCachedSizesToArray
          (EnumDescriptorProto *this,bool deterministic,uint8 *target)

{
  int iVar1;
  string *psVar2;
  EnumOptions *this_00;
  void *pvVar3;
  bool bVar4;
  uint uVar5;
  Type *this_01;
  uint8 *puVar6;
  uint uVar7;
  uint uVar8;
  byte *pbVar9;
  int index;
  
  uVar8 = (this->_has_bits_).has_bits_[0];
  if ((uVar8 & 1) != 0) {
    psVar2 = (this->name_).ptr_;
    internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "google.protobuf.EnumDescriptorProto.name");
    psVar2 = (this->name_).ptr_;
    *target = '\n';
    target = io::CodedOutputStream::WriteStringWithSizeToArray(psVar2,target + 1);
  }
  iVar1 = (this->value_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    index = 0;
    do {
      this_01 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumValueDescriptorProto>::TypeHandler>
                          (&(this->value_).super_RepeatedPtrFieldBase,index);
      *target = '\x12';
      pbVar9 = target + 1;
      uVar5 = this_01->_cached_size_;
      uVar7 = uVar5;
      if (0x7f < uVar5) {
        do {
          *pbVar9 = (byte)uVar5 | 0x80;
          uVar7 = uVar5 >> 7;
          pbVar9 = pbVar9 + 1;
          bVar4 = 0x3fff < uVar5;
          uVar5 = uVar7;
        } while (bVar4);
      }
      *pbVar9 = (byte)uVar7;
      target = EnumValueDescriptorProto::InternalSerializeWithCachedSizesToArray
                         (this_01,deterministic,pbVar9 + 1);
      index = index + 1;
    } while (index != iVar1);
  }
  if ((uVar8 & 2) != 0) {
    this_00 = this->options_;
    *target = '\x1a';
    pbVar9 = target + 1;
    uVar8 = this_00->_cached_size_;
    uVar5 = uVar8;
    if (0x7f < uVar8) {
      do {
        *pbVar9 = (byte)uVar8 | 0x80;
        uVar5 = uVar8 >> 7;
        pbVar9 = pbVar9 + 1;
        bVar4 = 0x3fff < uVar8;
        uVar8 = uVar5;
      } while (bVar4);
    }
    *pbVar9 = (byte)uVar5;
    target = EnumOptions::InternalSerializeWithCachedSizesToArray(this_00,deterministic,pbVar9 + 1);
  }
  pvVar3 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar3 & 1) != 0) {
    puVar6 = internal::WireFormat::SerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe),target);
    return puVar6;
  }
  return target;
}

Assistant:

::google::protobuf::uint8* EnumDescriptorProto::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.EnumDescriptorProto)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string name = 1;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.EnumDescriptorProto.name");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        1, this->name(), target);
  }

  // repeated .google.protobuf.EnumValueDescriptorProto value = 2;
  for (unsigned int i = 0, n = this->value_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        2, this->value(i), deterministic, target);
  }

  // optional .google.protobuf.EnumOptions options = 3;
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        3, *this->options_, deterministic, target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.EnumDescriptorProto)
  return target;
}